

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

int ON_CompareFloat(float a,float b)

{
  float b_local;
  float a_local;
  
  if (b <= a) {
    if (a <= b) {
      if ((a != b) || (NAN(a) || NAN(b))) {
        if (NAN(a)) {
          if (NAN(b)) {
            b_local = 0.0;
          }
          else {
            b_local = 1.4013e-45;
          }
        }
        else {
          b_local = -NAN;
        }
      }
      else {
        b_local = 0.0;
      }
    }
    else {
      b_local = 1.4013e-45;
    }
  }
  else {
    b_local = -NAN;
  }
  return (int)b_local;
}

Assistant:

int ON_CompareFloat(
  float a,
  float b
  )
{
  if (a < b)
    return -1;
  if (a > b)
    return 1;
  if (a == b)
    return 0;

  // below this point, a and/or b is a nan


  if (a == a)
    return -1; // b is a nan
  
  if (b == b)
    return 1; // ab is a nan

  return 0; // both a and b are nans
}